

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTruth.c
# Opt level: O0

uint * Aig_ManCutTruth(Aig_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,Vec_Ptr_t *vTruthElem,
                      Vec_Ptr_t *vTruthStore)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  void *pvVar4;
  void *pvVar5;
  uint *puVar6;
  int local_3c;
  int nWords;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vTruthStore_local;
  Vec_Ptr_t *vTruthElem_local;
  Vec_Ptr_t *vNodes_local;
  Vec_Ptr_t *vLeaves_local;
  Aig_Obj_t *pRoot_local;
  
  iVar1 = Vec_PtrSize(vLeaves);
  iVar2 = Vec_PtrSize(vTruthElem);
  if (iVar2 < iVar1) {
    __assert_fail("Vec_PtrSize(vLeaves) <= Vec_PtrSize(vTruthElem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTruth.c"
                  ,0x54,
                  "unsigned int *Aig_ManCutTruth(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  iVar1 = Vec_PtrSize(vNodes);
  iVar2 = Vec_PtrSize(vTruthStore);
  if (iVar2 < iVar1) {
    __assert_fail("Vec_PtrSize(vNodes) <= Vec_PtrSize(vTruthStore)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTruth.c"
                  ,0x55,
                  "unsigned int *Aig_ManCutTruth(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  iVar1 = Vec_PtrSize(vNodes);
  if ((iVar1 != 0) && (pAVar3 = (Aig_Obj_t *)Vec_PtrEntryLast(vNodes), pRoot != pAVar3)) {
    __assert_fail("Vec_PtrSize(vNodes) == 0 || pRoot == Vec_PtrEntryLast(vNodes)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTruth.c"
                  ,0x56,
                  "unsigned int *Aig_ManCutTruth(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(vLeaves), local_3c < iVar1; local_3c = local_3c + 1) {
    pvVar4 = Vec_PtrEntry(vLeaves,local_3c);
    pvVar5 = Vec_PtrEntry(vTruthElem,local_3c);
    *(void **)((long)pvVar4 + 0x28) = pvVar5;
  }
  iVar1 = Vec_PtrSize(vLeaves);
  iVar1 = Abc_TruthWordNum(iVar1);
  for (local_3c = 0; iVar2 = Vec_PtrSize(vNodes), local_3c < iVar2; local_3c = local_3c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,local_3c);
    puVar6 = (uint *)Vec_PtrEntry(vTruthStore,local_3c);
    puVar6 = Aig_ManCutTruthOne(pAVar3,puVar6,iVar1);
    (pAVar3->field_5).pData = puVar6;
  }
  return (uint *)(pRoot->field_5).pData;
}

Assistant:

unsigned * Aig_ManCutTruth( Aig_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Ptr_t * vTruthElem, Vec_Ptr_t * vTruthStore )
{
    Aig_Obj_t * pObj;
    int i, nWords;
    assert( Vec_PtrSize(vLeaves) <= Vec_PtrSize(vTruthElem) );
    assert( Vec_PtrSize(vNodes) <= Vec_PtrSize(vTruthStore) );
    assert( Vec_PtrSize(vNodes) == 0 || pRoot == Vec_PtrEntryLast(vNodes) );  
    // assign elementary truth tables
    Vec_PtrForEachEntry( Aig_Obj_t *, vLeaves, pObj, i )
        pObj->pData = Vec_PtrEntry( vTruthElem, i );
    // compute truths for other nodes
    nWords = Abc_TruthWordNum( Vec_PtrSize(vLeaves) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->pData = Aig_ManCutTruthOne( pObj, (unsigned *)Vec_PtrEntry(vTruthStore, i), nWords );
    return (unsigned *)pRoot->pData;
}